

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O3

void __thiscall
Diligent::
ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
::SetBufferOffset(ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                  *this,Uint32 Offset,Uint32 ArrayIndex)

{
  PipelineResourceDesc *pPVar1;
  string msg;
  string local_48;
  
  pPVar1 = ShaderVariableManagerGL::GetResourceDesc(this->m_ParentManager,this->m_ResIndex);
  if ((pPVar1->Flags & PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS) != PIPELINE_RESOURCE_FLAG_NONE) {
    FormatString<char[113]>
              (&local_48,
               (char (*) [113])
               "SetBufferOffset() is not only allowed for variables created with PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS flag."
              );
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"SetBufferOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x2c2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (pPVar1->VarType == SHADER_RESOURCE_VARIABLE_TYPE_STATIC) {
    FormatString<char[55]>
              (&local_48,(char (*) [55])"SetBufferOffset() is not allowed for static variables.");
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"SetBufferOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x2c4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  ShaderVariableManagerGL::GLVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo>::
  SetDynamicOffset((GLVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo> *)this,
                   ArrayIndex,Offset);
  return;
}

Assistant:

SetBufferOffset(Uint32 Offset,
                                                    Uint32 ArrayIndex) override final
    {
#ifdef DILIGENT_DEVELOPMENT
        {
            const PipelineResourceDesc& Desc = GetDesc();
            DEV_CHECK_ERR((Desc.Flags & PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS) == 0,
                          "SetBufferOffset() is not only allowed for variables created with PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS flag.");
            DEV_CHECK_ERR(Desc.VarType != SHADER_RESOURCE_VARIABLE_TYPE_STATIC,
                          "SetBufferOffset() is not allowed for static variables.");
        }
#endif

        static_cast<ThisImplType*>(this)->SetDynamicOffset(ArrayIndex, Offset);
    }